

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

Color4<double> * Imath_3_2::rgb2hsv<double>(Color4<double> *rgb)

{
  double *in_RSI;
  Color4<double> *in_RDI;
  Color4<double> c;
  Color4<double> v;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  Color4<double> local_30;
  
  Color4<double>::Color4(&local_30,*in_RSI,in_RSI[1],in_RSI[2],in_RSI[3]);
  Imath_3_2::rgb2hsv_d((Color4 *)&local_50);
  Color4<double>::Color4(in_RDI,local_50,local_48,local_40,local_38);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Color4<T>
                                   rgb2hsv (const Color4<T>& rgb) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Color4<double> v = Color4<double> (
            rgb.r / float (std::numeric_limits<T>::max ()),
            rgb.g / float (std::numeric_limits<T>::max ()),
            rgb.b / float (std::numeric_limits<T>::max ()),
            rgb.a / float (std::numeric_limits<T>::max ()));
        Color4<double> c = rgb2hsv_d (v);
        return Color4<T> (
            (T) (c.r * std::numeric_limits<T>::max ()),
            (T) (c.g * std::numeric_limits<T>::max ()),
            (T) (c.b * std::numeric_limits<T>::max ()),
            (T) (c.a * std::numeric_limits<T>::max ()));
    }
    else
    {
        Color4<double> v = Color4<double> (rgb.r, rgb.g, rgb.b, rgb.a);
        Color4<double> c = rgb2hsv_d (v);
        return Color4<T> ((T) c.r, (T) c.g, (T) c.b, (T) c.a);
    }
}